

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O1

bool __thiscall ExecutorRegVm::RemoveBreakpoint(ExecutorRegVm *this,uint instruction)

{
  uint uVar1;
  RegVmCmd *pRVar2;
  
  uVar1 = (this->exLinker->exRegVmCode).count;
  if (uVar1 < instruction) {
    NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"ERROR: break position out of code range");
LAB_0025118a:
    this->execErrorMessage = this->execErrorBuffer;
    return false;
  }
  if (instruction < uVar1) {
    pRVar2 = (this->exLinker->exRegVmCode).data;
    if (pRVar2[instruction].code != '\0') {
      NULLC::SafeSprintf(this->execErrorBuffer,0x10000,
                         "ERROR: there is no breakpoint at instruction %d",instruction);
      goto LAB_0025118a;
    }
    if (pRVar2[instruction].argument < (this->breakCode).count) {
      pRVar2[instruction] = (this->breakCode).data[pRVar2[instruction].argument];
      return true;
    }
  }
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x7f,
                "T &FastVector<RegVmCmd>::operator[](unsigned int) [T = RegVmCmd, zeroNewMemory = false, skipConstructor = false]"
               );
}

Assistant:

bool ExecutorRegVm::RemoveBreakpoint(unsigned instruction)
{
	if(instruction > exLinker->exRegVmCode.size())
	{
		NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "ERROR: break position out of code range");
		execErrorMessage = execErrorBuffer;
		return false;
	}

	if(exLinker->exRegVmCode[instruction].code != rviNop)
	{
		NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "ERROR: there is no breakpoint at instruction %d", instruction);
		execErrorMessage = execErrorBuffer;
		return false;
	}

	exLinker->exRegVmCode[instruction] = breakCode[exLinker->exRegVmCode[instruction].argument];
	return true;
}